

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

void helper_dmthlip_mips64(target_ulong rs,target_ulong ac,CPUMIPSState_conflict5 *env)

{
  byte bVar1;
  uint32_t uVar2;
  uint64_t tempA;
  uint64_t tempB;
  uint8_t pos;
  uint8_t ac_t;
  CPUMIPSState_conflict5 *env_local;
  target_ulong ac_local;
  target_ulong rs_local;
  
  bVar1 = (byte)ac & 3;
  (env->active_tc).HI[bVar1] = (env->active_tc).LO[bVar1];
  (env->active_tc).LO[bVar1] = rs;
  uVar2 = get_DSPControl_pos(env);
  if ((byte)uVar2 < 0x41) {
    set_DSPControl_pos((uint)(byte)((byte)uVar2 + 0x40),env);
  }
  return;
}

Assistant:

void helper_dmthlip(target_ulong rs, target_ulong ac, CPUMIPSState *env)
{
    uint8_t ac_t;
    uint8_t pos;
    uint64_t tempB, tempA;

    ac_t = ac & 0x3;

    tempA = rs;
    tempB = env->active_tc.LO[ac_t];

    env->active_tc.HI[ac_t] = tempB;
    env->active_tc.LO[ac_t] = tempA;

    pos = get_DSPControl_pos(env);

    if (pos <= 64) {
        pos = pos + 64;
        set_DSPControl_pos(pos, env);
    }
}